

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O2

void __thiscall
QSystemTrayIcon::showMessage
          (QSystemTrayIcon *this,QString *title,QString *msg,MessageIcon msgIcon,int msecs)

{
  QSystemTrayIconPrivate *this_00;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  QIcon local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSystemTrayIconPrivate **)&this->field_0x8;
  if (this_00->visible != true) goto LAB_0036bd9b;
  switch(msgIcon) {
  case NoIcon:
    QIcon::QIcon(&local_40);
    goto LAB_0036bd77;
  case Information:
    uStack_50 = 9;
    break;
  case Warning:
    uStack_50 = 10;
    break;
  case Critical:
    uStack_50 = 0xb;
    break;
  default:
    uStack_50 = 0xf0000000;
  }
  pQVar1 = QApplication::style();
  (**(code **)(*(long *)pQVar1 + 0x100))(&local_40,pQVar1,uStack_50,0,0);
LAB_0036bd77:
  QSystemTrayIconPrivate::showMessage_sys(this_00,title,msg,&local_40,msgIcon,msecs);
  QIcon::~QIcon(&local_40);
LAB_0036bd9b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSystemTrayIcon::showMessage(const QString& title, const QString& msg,
                            QSystemTrayIcon::MessageIcon msgIcon, int msecs)
{
    Q_D(QSystemTrayIcon);
    if (d->visible)
        d->showMessage_sys(title, msg, messageIcon2qIcon(msgIcon), msgIcon, msecs);
}